

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if2.c
# Opt level: O2

void ta(int pi)

{
  int iVar1;
  int iVar2;
  uint got;
  char text [2048];
  
  puts("Serial link tests.");
  iVar1 = serial_open(pi,"/dev/ttyAMA0",0xe100);
  CHECK(10,1,iVar1,0,0,"serial open");
  time_sleep(0x3fb999999999999a);
  serial_read(pi,iVar1,text);
  iVar2 = serial_data_available(pi,iVar1);
  CHECK(10,2,iVar2,0,0,"serial data available");
  iVar2 = serial_write(pi,iVar1,
                       "To be, or not to be, that is the question-Whether \'tis Nobler in the mind to sufferThe Slings and Arrows of outrageous Fortune,Or to take Arms against a Sea of troubles,"
                      );
  CHECK(10,3,iVar2,0,0,"serial write");
  serial_write_byte(pi,iVar1,0xaa);
  serial_write_byte(pi,iVar1,0x55);
  serial_write_byte(pi,iVar1,0);
  iVar2 = serial_write_byte(pi,iVar1,0xff);
  CHECK(10,4,iVar2,0,0,"serial write byte");
  time_sleep(0x3fb999999999999a);
  iVar2 = serial_data_available(pi,iVar1);
  CHECK(10,5,iVar2,0xad,0,"serial data available");
  got = serial_read(pi,iVar1,text,0xa9);
  CHECK(10,6,got,0xa9,0,"serial read");
  if (-1 < (int)got) {
    text[got] = '\0';
  }
  iVar2 = strcmp("To be, or not to be, that is the question-Whether \'tis Nobler in the mind to sufferThe Slings and Arrows of outrageous Fortune,Or to take Arms against a Sea of troubles,"
                 ,text);
  CHECK(10,7,iVar2,0,0,"serial read");
  iVar2 = serial_read_byte(pi,iVar1);
  CHECK(10,8,iVar2,0xaa,0,"serial read byte");
  iVar2 = serial_read_byte(pi,iVar1);
  CHECK(10,9,iVar2,0x55,0,"serial read byte");
  iVar2 = serial_read_byte(pi,iVar1);
  CHECK(10,10,iVar2,0,0,"serial read byte");
  iVar2 = serial_read_byte(pi,iVar1);
  CHECK(10,0xb,iVar2,0xff,0,"serial read byte");
  iVar2 = serial_data_available(pi,iVar1);
  CHECK(10,0xc,iVar2,0,0,"serial data availabe");
  iVar1 = serial_close(pi,iVar1);
  CHECK(10,0xd,iVar1,0,0,"serial close");
  return;
}

Assistant:

void ta(int pi)
{
   int h, b, e;
   char *TEXT;
   char text[2048];

   printf("Serial link tests.\n");

   /* this test needs RXD and TXD to be connected */

   h = serial_open(pi, "/dev/ttyAMA0", 57600, 0);

   CHECK(10, 1, h, 0, 0, "serial open");

   time_sleep(0.1); /* allow time for transmission */

   b = serial_read(pi, h, text, sizeof(text)); /* flush buffer */

   b = serial_data_available(pi, h);
   CHECK(10, 2, b, 0, 0, "serial data available");

   TEXT = "\
To be, or not to be, that is the question-\
Whether 'tis Nobler in the mind to suffer\
The Slings and Arrows of outrageous Fortune,\
Or to take Arms against a Sea of troubles,\
";
   e = serial_write(pi, h, TEXT, strlen(TEXT));
   CHECK(10, 3, e, 0, 0, "serial write");

   e = serial_write_byte(pi, h, 0xAA);
   e = serial_write_byte(pi, h, 0x55);
   e = serial_write_byte(pi, h, 0x00);
   e = serial_write_byte(pi, h, 0xFF);

   CHECK(10, 4, e, 0, 0, "serial write byte");

   time_sleep(0.1); /* allow time for transmission */

   b = serial_data_available(pi, h);
   CHECK(10, 5, b, strlen(TEXT)+4, 0, "serial data available");

   b = serial_read(pi, h, text, strlen(TEXT));
   CHECK(10, 6, b, strlen(TEXT), 0, "serial read");
   if (b >= 0) text[b] = 0;
   CHECK(10, 7, strcmp(TEXT, text), 0, 0, "serial read");

   b = serial_read_byte(pi, h);
   CHECK(10, 8, b, 0xAA, 0, "serial read byte");

   b = serial_read_byte(pi, h);
   CHECK(10, 9, b, 0x55, 0, "serial read byte");

   b = serial_read_byte(pi, h);
   CHECK(10, 10, b, 0x00, 0, "serial read byte");

   b = serial_read_byte(pi, h);
   CHECK(10, 11, b, 0xFF, 0, "serial read byte");

   b = serial_data_available(pi, h);
   CHECK(10, 12, b, 0, 0, "serial data availabe");

   e = serial_close(pi, h);
   CHECK(10, 13, e, 0, 0, "serial close");
}